

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envyas.c
# Opt level: O0

int resolve(asctx *ctx,ull *val,match m,ull pos)

{
  rbitfield *bf_00;
  uint uVar1;
  ull uVar2;
  ulong num_00;
  ull uVar3;
  ull totalsz;
  ull mask;
  ull num;
  rbitfield *bf;
  ull val_1;
  int i;
  ull pos_local;
  ull *val_local;
  asctx *ctx_local;
  
  val_1._4_4_ = 0;
  while( true ) {
    if (m.nrelocs <= val_1._4_4_) {
      for (val_1._4_4_ = 0; val_1._4_4_ < 2; val_1._4_4_ = val_1._4_4_ + 1) {
        val[val_1._4_4_] = m.a[val_1._4_4_];
      }
      return 1;
    }
    uVar2 = calc(m.relocs[val_1._4_4_].expr,ctx);
    bf_00 = m.relocs[val_1._4_4_].bf;
    mask = uVar2 - bf_00->addend;
    if (bf_00->pcrel != 0) {
      mask = mask - (pos + bf_00->pospreadd & -(1L << ((byte)bf_00->shr & 0x3f)));
    }
    num_00 = mask >> ((byte)bf_00->shr & 0x3f);
    setsbf(&m,bf_00->sbf[0].pos,bf_00->sbf[0].len,num_00);
    setsbf(&m,bf_00->sbf[1].pos,bf_00->sbf[1].len,num_00 >> ((byte)bf_00->sbf[0].len & 0x3f));
    ctx->pos = (uint32_t)pos;
    totalsz = 0xffffffffffffffff;
    uVar1 = bf_00->shr + bf_00->sbf[0].len + bf_00->sbf[1].len;
    if ((bf_00->wrapok != 0) && (uVar1 < 0x40)) {
      totalsz = (1L << ((byte)uVar1 & 0x3f)) - 1;
    }
    uVar3 = getrbf_as(bf_00,m.a,m.m,(ulong)ctx->pos);
    if ((uVar3 & totalsz) != (uVar2 & totalsz)) break;
    val_1._4_4_ = val_1._4_4_ + 1;
  }
  return 0;
}

Assistant:

int resolve (struct asctx *ctx, ull *val, struct match m, ull pos) {
	int i;
	for (i = 0; i < m.nrelocs; i++) {
		ull val = calc(m.relocs[i].expr, ctx);
		const struct rbitfield *bf = m.relocs[i].bf;
		ull num = val - bf->addend;
		if (bf->pcrel)
			num -= (pos + bf->pospreadd) & -(1ull << bf->shr);
		num >>= bf->shr;
		setsbf(&m, bf->sbf[0].pos, bf->sbf[0].len, num);
		num >>= bf->sbf[0].len;
		setsbf(&m, bf->sbf[1].pos, bf->sbf[1].len, num);
		ctx->pos = pos;
		ull mask = ~0ull;
		ull totalsz = bf->shr + bf->sbf[0].len + bf->sbf[1].len;
		if (bf->wrapok && totalsz < 64)
			mask = (1ull << totalsz) - 1;
		if ((getrbf_as(bf, m.a, m.m, ctx->pos) & mask) != (val & mask))
			return 0;
	}
	for (i = 0; i < MAXOPLEN; i++)
		val[i] = m.a[i];
	return 1;
}